

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O3

string * __thiscall
Disa::Matrix_Sparse::row_column_abi_cxx11_
          (string *__return_storage_ptr__,Matrix_Sparse *this,size_t i_row,size_t i_column)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  bool bVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  Matrix_Sparse *pMVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_t sVar10;
  uint uVar11;
  undefined8 uVar12;
  string __str_1;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar11 = 1;
  if ((Matrix_Sparse *)0x9 < this) {
    pMVar8 = this;
    uVar6 = 4;
    do {
      uVar11 = uVar6;
      if (pMVar8 < (Matrix_Sparse *)0x64) {
        uVar11 = uVar11 - 2;
        goto LAB_00130a70;
      }
      if (pMVar8 < (Matrix_Sparse *)0x3e8) {
        uVar11 = uVar11 - 1;
        goto LAB_00130a70;
      }
      if (pMVar8 < (Matrix_Sparse *)0x2710) goto LAB_00130a70;
      bVar5 = (Matrix_Sparse *)0x1869f < pMVar8;
      pMVar8 = (Matrix_Sparse *)((ulong)pMVar8 / 10000);
      uVar6 = uVar11 + 4;
    } while (bVar5);
    uVar11 = uVar11 + 1;
  }
LAB_00130a70:
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_48,(ulong)uVar11,'\0');
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_48._M_dataplus._M_p,(uint)local_48._M_string_length,(unsigned_long)this);
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_48,", ");
  paVar3 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar9) {
    local_68.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_68.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_68._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_68.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_68._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  uVar11 = 1;
  if (9 < i_row) {
    sVar10 = i_row;
    uVar6 = 4;
    do {
      uVar11 = uVar6;
      if (sVar10 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_00130b4a;
      }
      if (sVar10 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_00130b4a;
      }
      if (sVar10 < 10000) goto LAB_00130b4a;
      bVar5 = 99999 < sVar10;
      sVar10 = sVar10 / 10000;
      uVar6 = uVar11 + 4;
    } while (bVar5);
    uVar11 = uVar11 + 1;
  }
LAB_00130b4a:
  paVar9 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_88,(ulong)uVar11,'\0');
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_88._M_dataplus._M_p,(uint)local_88._M_string_length,i_row);
  uVar2 = CONCAT44(local_88._M_string_length._4_4_,(uint)local_88._M_string_length) +
          local_68._M_string_length;
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar3) {
    uVar12 = local_68.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < uVar2) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar9) {
      uVar12 = local_88.field_2._M_allocated_capacity;
    }
    if (uVar2 <= (ulong)uVar12) {
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_88,0,0,local_68._M_dataplus._M_p,local_68._M_string_length);
      goto LAB_00130bc7;
    }
  }
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_68,local_88._M_dataplus._M_p,
                     CONCAT44(local_88._M_string_length._4_4_,(uint)local_88._M_string_length));
LAB_00130bc7:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = (pbVar7->_M_dataplus)._M_p;
  paVar1 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar12 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar12;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar7->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar9) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar3) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] static std::string row_column(std::size_t i_row, std::size_t i_column) {
    return std::to_string(i_row) + ", " + std::to_string(i_column);
  }